

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ukf.cpp
# Opt level: O1

void __thiscall UKF::Prediction(UKF *this,double delta_t)

{
  MatrixXd *pMVar1;
  double *pdVar2;
  MatrixXd *__ptr;
  VectorXd *pVVar3;
  MatrixXd *pMVar4;
  DenseIndex size;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double dVar7;
  double dVar8;
  uint uVar9;
  Index size_3;
  PlainObject *pPVar11;
  undefined8 *puVar12;
  Index index;
  ulong uVar13;
  char *pcVar14;
  Index index_1;
  Index index_2;
  ulong uVar15;
  double *pdVar16;
  long lVar17;
  Index col;
  long lVar18;
  double *pdVar19;
  Index index_7;
  ulong uVar20;
  long lVar21;
  double *pdVar22;
  long lVar23;
  Index row;
  Index row_1;
  int iVar24;
  Matrix<double,__1,_1,_0,__1,_1> *other;
  long lVar25;
  bool bVar26;
  double dVar27;
  VectorXd x_aug;
  VectorXd x_pred;
  MatrixXd Xsig_aug;
  VectorXd x_diff;
  MatrixXd P_aug;
  MatrixXd P_pred;
  MatrixXd L;
  DenseStorage<double,__1,__1,_1,_0> local_190;
  DenseStorage<double,__1,__1,_1,_0> local_180;
  double local_170;
  undefined1 local_168 [24];
  void *pvStack_150;
  undefined8 uStack_148;
  undefined8 local_140;
  DenseStorage<double,__1,__1,__1,_0> local_138;
  double local_120;
  MatrixXd local_118;
  double local_100;
  DenseStorage<double,__1,__1,__1,_0> local_f8;
  DenseStorage<double,__1,__1,__1,_0> local_d8;
  double local_b8;
  void *local_b0;
  double *local_a8;
  long local_a0;
  PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *local_98;
  VectorXd *local_90;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  undefined8 uStack_60;
  double local_58;
  undefined8 uStack_50;
  DenseStorage<double,__1,__1,__1,_0> *local_48;
  PlainObject *local_40;
  uint uVar10;
  
  local_b8 = delta_t;
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage(&local_190,7,7,1);
  if (local_190.m_rows < 5) {
    pcVar14 = 
    "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
    ;
LAB_001053fa:
    __assert_fail("a_startRow >= 0 && blockRows >= 0 && a_startRow <= xpr.rows() - blockRows && a_startCol >= 0 && blockCols >= 0 && a_startCol <= xpr.cols() - blockCols"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/preritj[P]Unscented-Kalman-Filter/src/Eigen/src/Core/Block.h"
                  ,0x8d,pcVar14);
  }
  if ((this->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
      5) {
    pcVar14 = 
    "Derived &Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>, OtherDerived = Eigen::Matrix<double, -1, 1>]"
    ;
    goto LAB_00105336;
  }
  pVVar3 = &this->x_;
  uVar13 = 5;
  if (((ulong)local_190.m_data & 7) == 0) {
    uVar13 = (ulong)((uint)((ulong)local_190.m_data >> 3) & 1);
  }
  if (uVar13 != 0) {
    pdVar16 = (pVVar3->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
              m_data;
    uVar15 = 0;
    do {
      local_190.m_data[uVar15] = pdVar16[uVar15];
      uVar15 = uVar15 + 1;
    } while (uVar13 != uVar15);
  }
  uVar15 = uVar13 | 4;
  if (((ulong)local_190.m_data & 7) == 0) {
    do {
      pdVar16 = (pVVar3->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                m_data + uVar13;
      dVar7 = pdVar16[1];
      local_190.m_data[uVar13] = *pdVar16;
      (local_190.m_data + uVar13)[1] = dVar7;
      uVar13 = uVar13 + 2;
    } while (uVar13 < uVar15);
  }
  if ((uint)uVar15 < 5) {
    pdVar16 = (pVVar3->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
              m_data;
    do {
      local_190.m_data[uVar15] = pdVar16[uVar15];
      uVar15 = uVar15 + 1;
    } while (uVar15 != 5);
  }
  if ((local_190.m_rows < 6) ||
     (local_190.m_data[5] = 0.0, (double *)local_190.m_rows == (double *)0x6)) {
LAB_0010522f:
    __assert_fail("index >= 0 && index < size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/preritj[P]Unscented-Kalman-Filter/src/Eigen/src/Core/DenseCoeffsBase.h"
                  ,0x18a,
                  "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                 );
  }
  local_190.m_data[6] = 0.0;
  local_f8.m_cols = 0;
  local_f8.m_data = (double *)0x0;
  local_f8.m_rows = 0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_f8,0x31,7,7);
  local_168._0_8_ = local_f8.m_rows;
  local_168._8_8_ = local_f8.m_cols;
  local_168._16_8_ = (MatrixXd *)0x0;
  if ((local_f8.m_cols | local_f8.m_rows) < 0) {
LAB_0010537e:
    local_168._16_8_ = 0;
    __assert_fail("nbRows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == nbRows) && nbCols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == nbCols)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/preritj[P]Unscented-Kalman-Filter/src/Eigen/src/Core/CwiseNullaryOp.h"
                  ,0x3f,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, -1>]"
                 );
  }
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  lazyAssign<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_f8,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)local_168);
  if ((local_f8.m_rows < 5) || (local_f8.m_cols < 5)) {
    pcVar14 = 
    "Eigen::Block<Eigen::Matrix<double, -1, -1>>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = -1, BlockCols = -1, InnerPanel = false]"
    ;
    goto LAB_001053fa;
  }
  if (((this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
       == 5) &&
     ((this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
      == 5)) {
    uVar13 = 5;
    if (((ulong)local_f8.m_data & 7) == 0) {
      uVar13 = (ulong)((uint)((ulong)local_f8.m_data >> 3) & 1);
    }
    lVar17 = 0;
    lVar18 = 0;
    pdVar16 = local_f8.m_data;
    do {
      if (uVar13 != 0) {
        lVar25 = (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_rows;
        pdVar22 = (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_data;
        uVar15 = 0;
        do {
          pdVar16[uVar15] = *(double *)((long)pdVar22 + uVar15 * 8 + lVar25 * lVar17);
          uVar15 = uVar15 + 1;
        } while (uVar13 != uVar15);
      }
      uVar20 = (ulong)(5U - (int)uVar13 & 6);
      uVar15 = uVar13;
      if (uVar20 != 0) {
        do {
          pdVar22 = (double *)
                    ((long)(this->P_).
                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                           m_storage.m_data +
                    uVar15 * 8 +
                    (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_rows * lVar17);
          dVar7 = pdVar22[1];
          pdVar16[uVar15] = *pdVar22;
          (pdVar16 + uVar15)[1] = dVar7;
          uVar15 = uVar15 + 2;
        } while ((long)uVar15 < (long)(uVar20 + uVar13));
      }
      if (uVar20 + uVar13 < 5) {
        lVar21 = uVar20 + uVar13 + -1;
        lVar25 = (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_rows;
        pdVar22 = (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_data;
        do {
          pdVar16[lVar21 + 1] = *(double *)((long)pdVar22 + lVar21 * 8 + lVar25 * lVar17 + 8);
          lVar21 = lVar21 + 1;
        } while (lVar21 < 4);
      }
      uVar13 = (ulong)((int)uVar13 + (int)local_f8.m_rows & 1);
      lVar18 = lVar18 + 1;
      pdVar16 = pdVar16 + local_f8.m_rows;
      lVar17 = lVar17 + 8;
    } while (lVar18 != 5);
    if ((((local_f8.m_rows < 6) || (local_f8.m_cols < 6)) ||
        (local_f8.m_data[local_f8.m_rows * 5 + 5] = this->std_a_ * this->std_a_,
        (MatrixXd *)local_f8.m_rows == (MatrixXd *)0x6)) ||
       ((VectorXd *)local_f8.m_cols == (VectorXd *)0x6)) {
LAB_0010524e:
      __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/preritj[P]Unscented-Kalman-Filter/src/Eigen/src/Core/DenseCoeffsBase.h"
                    ,0x151,
                    "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>, Level = 1]"
                   );
    }
    local_f8.m_data[local_f8.m_rows * 6 + 6] = this->std_yawdd_ * this->std_yawdd_;
    Eigen::LLT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::LLT
              ((LLT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_168,(MatrixType *)&local_f8
              );
    if (pvStack_150._0_1_ == false) {
      __assert_fail("m_isInitialized && \"LLT is not initialized.\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/preritj[P]Unscented-Kalman-Filter/src/Eigen/src/Cholesky/LLT.h"
                    ,0x6a,
                    "typename Traits::MatrixL Eigen::LLT<Eigen::Matrix<double, -1, -1>>::matrixL() const [MatrixType = Eigen::Matrix<double, -1, -1>, UpLo = 1]"
                   );
    }
    local_138.m_data = (double *)local_168;
    Eigen::Matrix<double,-1,-1,0,-1,-1>::
    Matrix<Eigen::TriangularView<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1u>>
              ((Matrix<double,_1,_1,0,_1,_1> *)&local_b0,
               (EigenBase<Eigen::TriangularView<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1U>_>
                *)&local_138);
    free((void *)local_168._0_8_);
    uVar15 = (ulong)this->n_aug_;
    uVar13 = uVar15 * 2 + 1;
    local_138.m_data = (double *)0x0;
    local_138.m_rows = 0;
    local_138.m_cols = 0;
    if ((long)(uVar13 | uVar15) < 0) {
LAB_0010535f:
      __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (nbRows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (nbCols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (nbRows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (nbCols<=MaxColsAtCompileTime)) && nbRows>=0 && nbCols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/preritj[P]Unscented-Kalman-Filter/src/Eigen/src/Core/PlainObjectBase.h"
                    ,0xf1,
                    "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>]"
                   );
    }
    if ((this->n_aug_ != 0) &&
       (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816((long)uVar13),0) <
        (long)uVar15)) {
      puVar12 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar12 = operator_delete;
      __cxa_throw(puVar12,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_138,uVar13 * uVar15,uVar15,uVar13);
    if (local_138.m_rows < 0 && local_138.m_data != (double *)0x0) {
LAB_0010526d:
      __assert_fail("(dataPtr == 0) || ( nbRows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == nbRows) && nbCols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == nbCols))"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/preritj[P]Unscented-Kalman-Filter/src/Eigen/src/Core/MapBase.h"
                    ,0x94,
                    "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, Level = 0]"
                   );
    }
    if (local_138.m_cols < 1) {
LAB_0010528c:
      __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/preritj[P]Unscented-Kalman-Filter/src/Eigen/src/Core/Block.h"
                    ,0x76,
                    "Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>::Block(XprType &, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = -1, BlockCols = 1, InnerPanel = true]"
                   );
    }
    if (local_138.m_rows == local_190.m_rows) {
      pdVar16 = (double *)(ulong)((uint)((ulong)local_138.m_data >> 3) & 1);
      if (local_138.m_rows <= (long)pdVar16) {
        pdVar16 = (double *)local_138.m_rows;
      }
      if (((ulong)local_138.m_data & 7) != 0) {
        pdVar16 = (double *)local_138.m_rows;
      }
      lVar17 = local_138.m_rows - (long)pdVar16;
      if (0 < (long)pdVar16) {
        pdVar22 = (double *)0x0;
        do {
          local_138.m_data[(long)pdVar22] = local_190.m_data[(long)pdVar22];
          pdVar22 = (double *)((long)pdVar22 + 1);
        } while (pdVar16 != pdVar22);
      }
      pdVar22 = (double *)((lVar17 - (lVar17 >> 0x3f) & 0xfffffffffffffffeU) + (long)pdVar16);
      if (1 < lVar17) {
        do {
          dVar7 = (local_190.m_data + (long)pdVar16)[1];
          local_138.m_data[(long)pdVar16] = local_190.m_data[(long)pdVar16];
          (local_138.m_data + (long)pdVar16)[1] = dVar7;
          pdVar16 = (double *)((long)pdVar16 + 2);
        } while ((long)pdVar16 < (long)pdVar22);
      }
      if ((long)pdVar22 < local_138.m_rows) {
        do {
          local_138.m_data[(long)pdVar22] = local_190.m_data[(long)pdVar22];
          pdVar22 = (double *)((long)pdVar22 + 1);
          pdVar16 = local_190.m_data;
        } while ((double *)local_138.m_rows != pdVar22);
      }
      uVar10 = this->n_aug_;
      uVar13 = (ulong)uVar10;
      local_98 = (PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&this->P_;
      local_90 = pVVar3;
      if (0 < (int)uVar10) {
        lVar25 = 8;
        iVar24 = 1;
        lVar18 = 0;
        lVar17 = 0;
        do {
          dVar7 = (double)(int)uVar13 + this->lambda_;
          if (dVar7 < 0.0) {
            dVar7 = sqrt(dVar7);
          }
          else {
            dVar7 = SQRT(dVar7);
          }
          if (((long)local_a8 < 0) &&
             ((void *)((long)local_b0 + (long)local_a8 * lVar17 * 8) != (void *)0x0))
          goto LAB_0010526d;
          if (local_a0 <= lVar17) goto LAB_0010528c;
          if ((double *)local_190.m_rows != local_a8) {
            pcVar14 = 
            "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>>]"
            ;
            goto LAB_00105355;
          }
          lVar21 = lVar17 + 1;
          pdVar16 = local_138.m_data + local_138.m_rows * lVar21;
          if (local_138.m_rows < 0 && pdVar16 != (double *)0x0) goto LAB_0010526d;
          if (local_138.m_cols <= lVar21) goto LAB_0010528c;
          if ((double *)local_138.m_rows != local_a8) {
            pcVar14 = 
            "Derived &Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, OtherDerived = Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>>>]"
            ;
            goto LAB_00105336;
          }
          pdVar22 = (double *)(ulong)((uint)((ulong)pdVar16 >> 3) & 1);
          if (local_138.m_rows <= (long)pdVar22) {
            pdVar22 = (double *)local_138.m_rows;
          }
          if (((ulong)pdVar16 & 7) != 0) {
            pdVar22 = (double *)local_138.m_rows;
          }
          if (0 < (long)pdVar22) {
            pdVar16 = (double *)0x0;
            do {
              *(double *)((long)local_138.m_data + (long)pdVar16 * 8 + local_138.m_rows * lVar25) =
                   *(double *)((long)local_b0 + (long)pdVar16 * 8 + (long)local_a8 * lVar18) * dVar7
                   + local_190.m_data[(long)pdVar16];
              pdVar16 = (double *)((long)pdVar16 + 1);
            } while (pdVar22 != pdVar16);
          }
          lVar23 = local_138.m_rows - (long)pdVar22;
          pdVar16 = (double *)((lVar23 - (lVar23 >> 0x3f) & 0xfffffffffffffffeU) + (long)pdVar22);
          if (1 < lVar23) {
            do {
              dVar27 = (local_190.m_data + (long)pdVar22)[1];
              pdVar19 = (double *)((long)local_b0 + (long)pdVar22 * 8 + (long)local_a8 * lVar18);
              dVar8 = pdVar19[1];
              pdVar2 = (double *)
                       ((long)local_138.m_data + (long)pdVar22 * 8 + local_138.m_rows * lVar25);
              *pdVar2 = *pdVar19 * dVar7 + local_190.m_data[(long)pdVar22];
              pdVar2[1] = dVar8 * dVar7 + dVar27;
              pdVar22 = (double *)((long)pdVar22 + 2);
            } while ((long)pdVar22 < (long)pdVar16);
          }
          if ((long)pdVar16 < local_138.m_rows) {
            do {
              *(double *)((long)local_138.m_data + (long)pdVar16 * 8 + local_138.m_rows * lVar25) =
                   *(double *)((long)local_b0 + (long)pdVar16 * 8 + (long)local_a8 * lVar18) * dVar7
                   + local_190.m_data[(long)pdVar16];
              pdVar16 = (double *)((long)pdVar16 + 1);
            } while ((double *)local_138.m_rows != pdVar16);
          }
          dVar7 = (double)this->n_aug_ + this->lambda_;
          if (dVar7 < 0.0) {
            dVar7 = sqrt(dVar7);
          }
          else {
            dVar7 = SQRT(dVar7);
          }
          if (((long)local_a8 < 0) &&
             ((void *)((long)local_b0 + (long)local_a8 * lVar17 * 8) != (void *)0x0))
          goto LAB_0010526d;
          if (local_a0 <= lVar17) goto LAB_0010528c;
          if ((double *)local_190.m_rows != local_a8) {
            pcVar14 = 
            "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>>]"
            ;
            goto LAB_00105355;
          }
          pdVar16 = (double *)(long)this->n_aug_;
          lVar17 = (long)(int)lVar21 + (long)pdVar16;
          pdVar22 = local_138.m_data + local_138.m_rows * lVar17;
          if ((local_138.m_rows < 0) && (pdVar22 != (double *)0x0)) goto LAB_0010526d;
          if (((int)lVar17 < 0) || (local_138.m_cols <= lVar17)) goto LAB_0010528c;
          if ((double *)local_138.m_rows != local_a8) {
            pcVar14 = 
            "Derived &Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, OtherDerived = Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>>>]"
            ;
            goto LAB_00105336;
          }
          lVar17 = (long)iVar24;
          pdVar19 = (double *)(ulong)((uint)((ulong)pdVar22 >> 3) & 1);
          if (local_138.m_rows <= (long)pdVar19) {
            pdVar19 = (double *)local_138.m_rows;
          }
          if (((ulong)pdVar22 & 7) != 0) {
            pdVar19 = (double *)local_138.m_rows;
          }
          if (0 < (long)pdVar19) {
            pdVar22 = (double *)0x0;
            do {
              local_138.m_data[(long)(((long)pdVar16 + lVar17) * local_138.m_rows + (long)pdVar22)]
                   = local_190.m_data[(long)pdVar22] -
                     *(double *)((long)local_b0 + (long)pdVar22 * 8 + (long)local_a8 * lVar18) *
                     dVar7;
              pdVar22 = (double *)((long)pdVar22 + 1);
            } while (pdVar19 != pdVar22);
          }
          lVar23 = local_138.m_rows - (long)pdVar19;
          pdVar22 = (double *)((lVar23 - (lVar23 >> 0x3f) & 0xfffffffffffffffeU) + (long)pdVar19);
          if (1 < lVar23) {
            do {
              dVar27 = (local_190.m_data + (long)pdVar19)[1];
              pdVar2 = (double *)((long)local_b0 + (long)pdVar19 * 8 + (long)local_a8 * lVar18);
              dVar8 = pdVar2[1];
              local_138.m_data[(long)(((long)pdVar16 + lVar17) * local_138.m_rows + (long)pdVar19)]
                   = local_190.m_data[(long)pdVar19] - *pdVar2 * dVar7;
              (local_138.m_data +
              (long)(((long)pdVar16 + lVar17) * local_138.m_rows + (long)pdVar19))[1] =
                   dVar27 - dVar8 * dVar7;
              pdVar19 = (double *)((long)pdVar19 + 2);
            } while ((long)pdVar19 < (long)pdVar22);
          }
          if ((long)pdVar22 < local_138.m_rows) {
            pdVar16 = local_138.m_data + ((long)pdVar16 + lVar17) * local_138.m_rows;
            do {
              pdVar16[(long)pdVar22] =
                   local_190.m_data[(long)pdVar22] -
                   *(double *)((long)local_b0 + (long)pdVar22 * 8 + (long)local_a8 * lVar18) * dVar7
              ;
              pdVar22 = (double *)((long)pdVar22 + 1);
            } while ((double *)local_138.m_rows != pdVar22);
          }
          uVar10 = this->n_aug_;
          uVar13 = (ulong)(int)uVar10;
          lVar25 = lVar25 + 8;
          lVar18 = lVar18 + 8;
          iVar24 = iVar24 + 1;
          lVar17 = lVar21;
        } while (lVar21 < (long)uVar13);
      }
      uVar9 = uVar10 * 2 + 1;
      local_168._0_8_ = (MatrixXd *)0x0;
      local_168._8_8_ = (VectorXd *)0x0;
      local_168._16_8_ = (MatrixXd *)0x0;
      uVar10 = this->n_x_;
      lVar18 = (long)(int)uVar10;
      lVar17 = (long)(int)uVar9;
      if ((int)(uVar10 | uVar9) < 0) goto LAB_0010535f;
      if ((uVar10 != 0) &&
         (auVar5 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
         SUB168(auVar5 / SEXT816(lVar17),0) < lVar18)) {
        puVar12 = (undefined8 *)
                  __cxa_allocate_exception(8,pdVar16,SUB168(auVar5 % SEXT816(lVar17),0));
        *puVar12 = operator_delete;
        __cxa_throw(puVar12,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                ((DenseStorage<double,__1,__1,__1,_0> *)local_168,lVar18 * lVar17,lVar18,lVar17);
      pMVar1 = &this->Xsig_pred_;
      __ptr = (MatrixXd *)
              (this->Xsig_pred_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_data;
      (this->Xsig_pred_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
      m_data = (double *)local_168._0_8_;
      pVVar3 = (VectorXd *)
               (this->Xsig_pred_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_rows;
      (this->Xsig_pred_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
      m_rows = local_168._8_8_;
      pMVar4 = (MatrixXd *)
               (this->Xsig_pred_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_cols;
      (this->Xsig_pred_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
      m_cols = local_168._16_8_;
      local_168._0_8_ = __ptr;
      local_168._8_8_ = pVVar3;
      local_168._16_8_ = pMVar4;
      free(__ptr);
      if (-1 < this->n_aug_) {
        local_88 = local_b8 * local_b8;
        lVar17 = -1;
        do {
          if ((((local_138.m_rows < 1) || (lVar17 = lVar17 + 1, local_138.m_cols <= lVar17)) ||
              (local_138.m_rows < 2)) ||
             ((((double *)local_138.m_rows == (double *)0x2 || (local_138.m_rows < 4)) ||
              (((double *)local_138.m_rows == (double *)0x4 ||
               ((local_138.m_rows < 6 || ((double *)local_138.m_rows == (double *)0x6))))))))
          goto LAB_0010524e;
          lVar18 = local_138.m_rows * lVar17;
          local_170 = local_138.m_data[lVar18];
          local_118.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_cols = (DenseIndex)local_138.m_data[lVar18 + 1];
          local_80 = local_138.m_data[lVar18 + 2];
          dVar7 = local_138.m_data[lVar18 + 3];
          local_58 = local_138.m_data[lVar18 + 4];
          local_78 = local_138.m_data[lVar18 + 5];
          local_70 = local_138.m_data[lVar18 + 6];
          local_68 = local_58 * local_b8 + dVar7;
          uStack_50 = 0;
          uStack_60 = 0;
          if (ABS(local_58) <= 0.001) {
            local_120 = local_80 * local_b8;
            dVar27 = cos(dVar7);
            local_100 = dVar27 * local_120 + local_170;
            dVar27 = sin(dVar7);
            local_170 = dVar27 * local_120 +
                        (double)local_118.
                                super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                                m_storage.m_cols;
          }
          else {
            local_120 = local_80 / local_58;
            local_100 = sin(local_68);
            dVar27 = sin(dVar7);
            local_100 = (local_100 - dVar27) * local_120 + local_170;
            local_170 = cos(dVar7);
            dVar27 = cos(local_68);
            local_170 = (local_170 - dVar27) * local_120 +
                        (double)local_118.
                                super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                                m_storage.m_cols;
          }
          local_118.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_cols = (DenseIndex)cos(dVar7);
          dVar7 = sin(dVar7);
          lVar18 = (this->Xsig_pred_).
                   super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
          ;
          if ((lVar18 < 1) ||
             ((this->Xsig_pred_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_cols <= lVar17)) goto LAB_0010524e;
          dVar27 = local_78 * 0.5 * local_88;
          pdVar16 = (pMVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                    m_storage.m_data;
          lVar25 = lVar18 * lVar17;
          pdVar16[lVar25] =
               (double)local_118.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                       m_storage.m_cols * dVar27 + local_100;
          if ((lVar18 < 2) ||
             (((pdVar16[lVar25 + 1] = dVar27 * dVar7 + local_170, lVar18 == 2 ||
               (pdVar16[lVar25 + 2] = local_78 * local_b8 + local_80, lVar18 < 4)) ||
              (pdVar16[lVar25 + 3] = local_70 * 0.5 * local_88 + local_68, lVar18 == 4))))
          goto LAB_0010524e;
          pdVar16[lVar25 + 4] = local_70 * local_b8 + local_58;
        } while (SBORROW8(lVar17,(long)this->n_aug_ * 2) != lVar17 + (long)this->n_aug_ * -2 < 0);
      }
      pVVar3 = &this->weights_;
      local_168._16_8_ = (MatrixXd *)0x0;
      pvStack_150 = (void *)0x0;
      local_168._0_8_ = pMVar1;
      local_168._8_8_ = pVVar3;
      if ((this->Xsig_pred_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
          m_storage.m_cols !=
          (this->weights_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
          m_rows) {
        __assert_fail("a_lhs.cols() == a_rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/preritj[P]Unscented-Kalman-Filter/src/Eigen/src/Core/ProductBase.h"
                      ,0x66,
                      "Eigen::ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, 1>, 4>, Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, 1>>::ProductBase(const Lhs &, const Rhs &) [Derived = Eigen::GeneralProduct<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, 1>, 4>, Lhs = Eigen::Matrix<double, -1, -1>, Rhs = Eigen::Matrix<double, -1, 1>]"
                     );
      }
      pPVar11 = Eigen::ProductBase::operator_cast_to_Matrix_((ProductBase *)local_168);
      size = (pPVar11->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_rows;
      Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage(&local_180,size,size,1);
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_180,
                 (pPVar11->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
                 .m_rows,1);
      if (local_180.m_rows ==
          (pPVar11->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
         ) {
        uVar13 = local_180.m_rows - (local_180.m_rows >> 0x3f) & 0xfffffffffffffffe;
        if (1 < local_180.m_rows) {
          lVar17 = 0;
          do {
            pdVar16 = (pPVar11->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                      m_storage.m_data + lVar17;
            dVar7 = pdVar16[1];
            local_180.m_data[lVar17] = *pdVar16;
            (local_180.m_data + lVar17)[1] = dVar7;
            lVar17 = lVar17 + 2;
          } while (lVar17 < (long)uVar13);
        }
        if ((long)uVar13 < local_180.m_rows) {
          pdVar16 = (pPVar11->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                    m_storage.m_data;
          do {
            local_180.m_data[uVar13] = pdVar16[uVar13];
            uVar13 = uVar13 + 1;
          } while (local_180.m_rows != uVar13);
        }
        free((void *)local_168._16_8_);
        local_d8.m_data = (double *)0x0;
        local_d8.m_rows = 0;
        local_d8.m_cols = 0;
        uVar13 = (ulong)this->n_x_;
        if ((long)uVar13 < 0) goto LAB_0010535f;
        if ((this->n_x_ != 0) &&
           (auVar5._8_8_ = 0, auVar5._0_8_ = uVar13,
           SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / auVar5,0) < (long)uVar13)) {
          puVar12 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar12 = operator_delete;
          __cxa_throw(puVar12,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
        }
        Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_d8,uVar13 * uVar13,uVar13,uVar13);
        local_168._0_8_ = local_d8.m_rows;
        local_168._8_8_ = local_d8.m_cols;
        local_168._16_8_ = (MatrixXd *)0x0;
        if ((local_d8.m_cols | local_d8.m_rows) < 0) goto LAB_0010537e;
        Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
        lazyAssign<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
                  ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_d8,
                   (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                    *)local_168);
        if (-1 < this->n_aug_) {
          lVar18 = 0;
          lVar17 = 0;
          do {
            pdVar16 = (this->Xsig_pred_).
                      super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                      m_data;
            uVar13 = (this->Xsig_pred_).
                     super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                     m_rows;
            if (((long)uVar13 < 0) && (pdVar16 + uVar13 * lVar17 != (double *)0x0))
            goto LAB_0010526d;
            if ((this->Xsig_pred_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_cols <= lVar17) goto LAB_0010528c;
            if (uVar13 != local_180.m_rows) {
              pcVar14 = 
              "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, Rhs = const Eigen::Matrix<double, -1, 1>]"
              ;
LAB_00105355:
              __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/preritj[P]Unscented-Kalman-Filter/src/Eigen/src/Core/CwiseBinaryOp.h"
                            ,0x84,pcVar14);
            }
            Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
                      ((DenseStorage<double,__1,__1,_1,_0> *)&local_118,local_180.m_rows,
                       local_180.m_rows,1);
            Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                      ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_118,
                       local_180.m_rows,1);
            if (local_118.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                .m_rows != local_180.m_rows) {
              pcVar14 = 
              "Derived &Eigen::DenseBase<Eigen::Matrix<double, -1, 1>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Matrix<double, -1, 1>, OtherDerived = Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, const Eigen::Matrix<double, -1, 1>>]"
              ;
              goto LAB_00105336;
            }
            uVar15 = local_118.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_rows -
                     (local_118.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                      m_storage.m_rows >> 0x3f) & 0xfffffffffffffffe;
            if (1 < local_118.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_rows) {
              lVar25 = 0;
              do {
                pdVar22 = (double *)((long)pdVar16 + lVar25 * 8 + uVar13 * lVar18);
                dVar7 = pdVar22[1] - (local_180.m_data + lVar25)[1];
                auVar6._8_4_ = SUB84(dVar7,0);
                auVar6._0_8_ = *pdVar22 - local_180.m_data[lVar25];
                auVar6._12_4_ = (int)((ulong)dVar7 >> 0x20);
                *(undefined1 (*) [16])
                 (local_118.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_data + lVar25) = auVar6;
                lVar25 = lVar25 + 2;
              } while (lVar25 < (long)uVar15);
            }
            if ((long)uVar15 <
                local_118.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                .m_rows) {
              do {
                local_118.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                .m_data[uVar15] =
                     *(double *)((long)pdVar16 + uVar15 * 8 + uVar13 * lVar18) -
                     local_180.m_data[uVar15];
                uVar15 = uVar15 + 1;
              } while (local_118.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                       m_storage.m_rows != uVar15);
            }
            if (local_118.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                .m_rows < 4) goto LAB_0010522f;
            dVar7 = local_118.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_data[3];
            while (3.141592653589793 < dVar7) {
              dVar7 = dVar7 + -6.283185307179586;
              local_118.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_data[3] = dVar7;
              if (local_118.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_rows < 4) goto LAB_0010522f;
            }
            dVar7 = local_118.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_data[3];
            if (dVar7 < -3.141592653589793) {
              do {
                dVar7 = dVar7 + 6.283185307179586;
              } while (dVar7 < -3.141592653589793);
              local_118.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_data[3] = dVar7;
            }
            if ((this->weights_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                m_storage.m_rows <= lVar17) goto LAB_0010522f;
            local_168._8_8_ =
                 (pVVar3->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                 m_data[lVar17];
            pvStack_150 = (void *)0x0;
            uStack_148 = 0;
            local_140 = 0;
            local_168._0_8_ = &local_118;
            local_168._16_8_ = &local_118;
            local_48 = &local_d8;
            local_40 = Eigen::ProductBase::operator_cast_to_Matrix_((ProductBase *)local_168);
            if (((MatrixXd *)local_d8.m_rows !=
                 (MatrixXd *)
                 (((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_168._0_8_)->
                 m_storage).m_rows) ||
               ((undefined1 *)local_d8.m_cols !=
                (undefined1 *)
                (((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_168._16_8_)->
                m_storage).m_rows)) {
              pcVar14 = 
              "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, -1>, const Eigen::GeneralProduct<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::Matrix<double, -1, 1>>, Eigen::Transpose<Eigen::Matrix<double, -1, 1>>, 2>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Matrix<double, -1, -1>, Rhs = const Eigen::GeneralProduct<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::Matrix<double, -1, 1>>, Eigen::Transpose<Eigen::Matrix<double, -1, 1>>, 2>]"
              ;
              goto LAB_00105355;
            }
            Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
            lazyAssign<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::GeneralProduct<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>,Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>>,2>const>>
                      ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_d8,
                       (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::GeneralProduct<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_2>_>_>
                        *)&local_48);
            free(pvStack_150);
            free(local_118.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data);
            lVar18 = lVar18 + 8;
            bVar26 = SBORROW8(lVar17,(long)this->n_aug_ * 2);
            lVar25 = lVar17 + (long)this->n_aug_ * -2;
            lVar17 = lVar17 + 1;
          } while (bVar26 != lVar25 < 0);
        }
        pVVar3 = local_90;
        Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                  (&local_90->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
                   local_180.m_rows,1);
        uVar13 = (this->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                 .m_rows;
        if (uVar13 == local_180.m_rows) {
          uVar15 = uVar13 - ((long)uVar13 >> 0x3f) & 0xfffffffffffffffe;
          if (1 < (long)uVar13) {
            lVar17 = 0;
            do {
              dVar7 = (local_180.m_data + lVar17)[1];
              pdVar16 = (pVVar3->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                        m_storage.m_data + lVar17;
              *pdVar16 = local_180.m_data[lVar17];
              pdVar16[1] = dVar7;
              lVar17 = lVar17 + 2;
            } while (lVar17 < (long)uVar15);
          }
          if ((long)uVar15 < (long)uVar13) {
            pdVar16 = (pVVar3->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                      m_storage.m_data;
            do {
              pdVar16[uVar15] = local_180.m_data[uVar15];
              uVar15 = uVar15 + 1;
            } while (uVar13 != uVar15);
          }
          Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
          lazyAssign<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                    (local_98,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_d8);
          free(local_d8.m_data);
          free(local_180.m_data);
          free(local_138.m_data);
          free(local_b0);
          free(local_f8.m_data);
          free(local_190.m_data);
          return;
        }
      }
      pcVar14 = 
      "Derived &Eigen::DenseBase<Eigen::Matrix<double, -1, 1>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Matrix<double, -1, 1>, OtherDerived = Eigen::Matrix<double, -1, 1>]"
      ;
    }
    else {
      pcVar14 = 
      "Derived &Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, OtherDerived = Eigen::Matrix<double, -1, 1>]"
      ;
    }
  }
  else {
    pcVar14 = 
    "Derived &Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, -1, -1>>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>>, OtherDerived = Eigen::Matrix<double, -1, -1>]"
    ;
  }
LAB_00105336:
  __assert_fail("rows() == other.rows() && cols() == other.cols()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/preritj[P]Unscented-Kalman-Filter/src/Eigen/src/Core/Assign.h"
                ,0x1f9,pcVar14);
}

Assistant:

void UKF::Prediction(double delta_t) {
  /**
  TODO:

  Complete this function! Estimate the object's location. Modify the state
  vector, x_. Predict sigma points, the state, and the state covariance matrix.
  */

  //create augmented mean state
  VectorXd x_aug = VectorXd(7);
  x_aug.head(5) = x_;
  x_aug(5) = 0;
  x_aug(6) = 0;

  //create augmented covariance matrix
  MatrixXd P_aug = MatrixXd(7, 7);
  P_aug.fill(0.0);
  P_aug.topLeftCorner(5,5) = P_;
  P_aug(5,5) = std_a_*std_a_;
  P_aug(6,6) = std_yawdd_*std_yawdd_;

  //calculate square root of P
  MatrixXd L = P_aug.llt().matrixL();

  //create augmented sigma points
  MatrixXd Xsig_aug = MatrixXd(n_aug_, 2 * n_aug_ + 1);
  Xsig_aug.col(0)  = x_aug;
  for (int i = 0; i< n_aug_; i++)
  {
    Xsig_aug.col(i+1)       = x_aug + sqrt(lambda_+n_aug_) * L.col(i);
    Xsig_aug.col(i+1+n_aug_) = x_aug - sqrt(lambda_+n_aug_) * L.col(i);
  }

  //predict sigma points
  Xsig_pred_ = MatrixXd(n_x_, 2 * n_aug_ + 1);
  for (int i = 0; i< 2*n_aug_+1; i++)
  {
    //extract values for better readability
    double p_x = Xsig_aug(0,i);
    double p_y = Xsig_aug(1,i);
    double v = Xsig_aug(2,i);
    double yaw = Xsig_aug(3,i);
    double yawd = Xsig_aug(4,i);
    double nu_a = Xsig_aug(5,i);
    double nu_yawdd = Xsig_aug(6,i);

    //predicted state values
    double px_p, py_p;
    double v_p = v;
    double yaw_p = yaw + yawd*delta_t;
    double yawd_p = yawd;

    //avoid division by zero
    if (fabs(yawd) > 0.001) {
      px_p = p_x + v/yawd * ( sin (yaw_p) - sin(yaw));
      py_p = p_y + v/yawd * ( cos(yaw) - cos(yaw_p) );
    }
    else {
      px_p = p_x + v*delta_t*cos(yaw);
      py_p = p_y + v*delta_t*sin(yaw);
    }

    //add noise
    double dt2 = delta_t * delta_t;
    px_p += 0.5*nu_a*dt2 * cos(yaw);
    py_p += 0.5*nu_a*dt2 * sin(yaw);
    v_p  += nu_a*delta_t;

    yaw_p  += 0.5*nu_yawdd*dt2;
    yawd_p += nu_yawdd*delta_t;

    //write predicted sigma point into right column
    Xsig_pred_(0,i) = px_p;
    Xsig_pred_(1,i) = py_p;
    Xsig_pred_(2,i) = v_p;
    Xsig_pred_(3,i) = yaw_p;
    Xsig_pred_(4,i) = yawd_p;
  }
  

  //predicted state mean
  VectorXd x_pred = Xsig_pred_ * weights_ ;

  //predicted state covariance matrix
  MatrixXd P_pred = MatrixXd(n_x_, n_x_);
  P_pred.fill(0.0);
  for (int i = 0; i < 2 * n_aug_ + 1; i++) {  //iterate over sigma points

  // state difference
  VectorXd x_diff = Xsig_pred_.col(i) - x_pred;
  //angle normalization
  while (x_diff(3)> M_PI) x_diff(3)-=2.*M_PI;
  while (x_diff(3)<-M_PI) x_diff(3)+=2.*M_PI;

    P_pred = P_pred + weights_(i) * x_diff * x_diff.transpose() ;
  }

  x_ = x_pred;
  P_ = P_pred;
}